

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

void __thiscall
QAccessiblePlainTextEdit::setText(QAccessiblePlainTextEdit *this,Text t,QString *text)

{
  bool bVar1;
  QWidget *pQVar2;
  undefined4 in_register_00000034;
  
  if (t != Value) {
    QAccessibleObject::setText((Text)this,(QString *)CONCAT44(in_register_00000034,t));
    return;
  }
  pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  bVar1 = QPlainTextEdit::isReadOnly((QPlainTextEdit *)pQVar2);
  if (bVar1) {
    return;
  }
  pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  QPlainTextEdit::setPlainText((QPlainTextEdit *)pQVar2,text);
  return;
}

Assistant:

void QAccessiblePlainTextEdit::setText(QAccessible::Text t, const QString &text)
{
    if (t != QAccessible::Value) {
        QAccessibleWidget::setText(t, text);
        return;
    }
    if (plainTextEdit()->isReadOnly())
        return;

    plainTextEdit()->setPlainText(text);
}